

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall
spdlog::logger::set_formatter
          (logger *this,unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *f)

{
  bool bVar1;
  element_type *peVar2;
  pointer pfVar3;
  iterator it;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  *in_stack_ffffffffffffff80;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_stack_ffffffffffffff90;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *this_00;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  local_58 [3];
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_40;
  shared_ptr<spdlog::sinks::sink> *local_38;
  shared_ptr<spdlog::sinks::sink> *local_30;
  shared_ptr<spdlog::sinks::sink> *local_28;
  shared_ptr<spdlog::sinks::sink> *local_20;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (shared_ptr<spdlog::sinks::sink> *)
       std::
       vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
       ::begin((vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
                *)in_stack_ffffffffffffff78._M_current);
  while( true ) {
    local_20 = (shared_ptr<spdlog::sinks::sink> *)
               std::
               vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
               ::end((vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
                      *)in_stack_ffffffffffffff78._M_current);
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                        *)in_stack_ffffffffffffff78._M_current);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    local_30 = local_18[0]._M_current;
    local_28 = (shared_ptr<spdlog::sinks::sink> *)
               std::
               next<__gnu_cxx::__normal_iterator<std::shared_ptr<spdlog::sinks::sink>*,std::vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>>>
                         (in_stack_ffffffffffffff78,0x69d1ea);
    local_38 = (shared_ptr<spdlog::sinks::sink> *)
               std::
               vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
               ::end((vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
                      *)in_stack_ffffffffffffff78._M_current);
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                        *)in_stack_ffffffffffffff78._M_current);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
    ::operator*(local_18);
    in_stack_ffffffffffffff78._M_current =
         (shared_ptr<spdlog::sinks::sink> *)
         std::__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x69d295);
    pfVar3 = CLI::std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::
             operator->((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                        0x69d2a3);
    in_stack_ffffffffffffff80 = local_58;
    (*pfVar3->_vptr_formatter[3])();
    (*((element_type *)in_stack_ffffffffffffff78._M_current)->_vptr_sink[5])
              (in_stack_ffffffffffffff78._M_current,in_stack_ffffffffffffff80);
    CLI::std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
              (in_stack_ffffffffffffff90);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
    ::operator++(local_18);
  }
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  ::operator*(local_18);
  peVar2 = std::__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x69d229);
  this_00 = &local_40;
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::unique_ptr
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             in_stack_ffffffffffffff80,
             (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             in_stack_ffffffffffffff78._M_current);
  (*peVar2->_vptr_sink[5])(peVar2,this_00);
  CLI::std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (this_00);
  return;
}

Assistant:

SPDLOG_INLINE void logger::set_formatter(std::unique_ptr<formatter> f) {
    for (auto it = sinks_.begin(); it != sinks_.end(); ++it) {
        if (std::next(it) == sinks_.end()) {
            // last element - we can be move it.
            (*it)->set_formatter(std::move(f));
            break;  // to prevent clang-tidy warning
        } else {
            (*it)->set_formatter(f->clone());
        }
    }
}